

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O1

void Sbd_ManCutReload(Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,int LevStop,Vec_Int_t *vCut,
                     Vec_Int_t *vCutTop,Vec_Int_t *vCutBot)

{
  uint Entry;
  long lVar1;
  ulong uVar2;
  Vec_Int_t *p;
  
  vCutTop->nSize = 0;
  vCutBot->nSize = 0;
  if (0 < vCut->nSize) {
    lVar1 = 0;
    do {
      Entry = vCut->pArray[lVar1];
      uVar2 = (ulong)Entry;
      if (uVar2 == 0) {
        __assert_fail("Entry",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0xe0,
                      "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (((int)Entry < 0) || (vMirrors->nSize <= (int)Entry)) {
LAB_0054383b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vMirrors->pArray[uVar2] != -1) {
        __assert_fail("Vec_IntEntry(vMirrors, Entry) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0xe1,
                      "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (vLutLevs->nSize <= (int)Entry) goto LAB_0054383b;
      if (LevStop < vLutLevs->pArray[uVar2]) {
        __assert_fail("Vec_IntEntry(vLutLevs, Entry) <= LevStop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0xe2,
                      "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      p = vCutTop;
      if (vLutLevs->pArray[uVar2] != LevStop) {
        p = vCutBot;
      }
      Vec_IntPush(p,Entry);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vCut->nSize);
  }
  Vec_IntIsOrdered(vCut);
  return;
}

Assistant:

void Sbd_ManCutReload( Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, int LevStop, Vec_Int_t * vCut, Vec_Int_t * vCutTop, Vec_Int_t * vCutBot )
{
    int i, Entry;
    Vec_IntClear( vCutTop );
    Vec_IntClear( vCutBot );
    Vec_IntForEachEntry( vCut, Entry, i )
    {
        assert( Entry );
        assert( Vec_IntEntry(vMirrors, Entry) == -1 );
        assert( Vec_IntEntry(vLutLevs, Entry) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Entry) == LevStop )
            Vec_IntPush( vCutTop, Entry );
        else
            Vec_IntPush( vCutBot, Entry );
    }
    Vec_IntIsOrdered( vCut );
}